

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandQueueVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::CommandQueueVkImpl::EnqueueSignalFence(CommandQueueVkImpl *this,VkFence vkFence)

{
  int iVar1;
  VkResult VVar2;
  string msg;
  string local_38;
  
  if (vkFence == (VkFence)0x0) {
    FormatString<char[25]>(&local_38,(char (*) [25])"vkFence must not be null");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"EnqueueSignalFence",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/CommandQueueVkImpl.cpp"
               ,0xf6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_QueueMutex);
  if (iVar1 == 0) {
    VVar2 = (*vkQueueSubmit)(this->m_VkQueue,0,(VkSubmitInfo *)0x0,vkFence);
    if (VVar2 != VK_SUCCESS) {
      FormatString<char[59]>
                (&local_38,
                 (char (*) [59])"Failed to submit fence signal command to the command queue");
      DebugAssertionFailed
                (local_38._M_dataplus._M_p,"EnqueueSignalFence",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/CommandQueueVkImpl.cpp"
                 ,0xfb);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_QueueMutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void CommandQueueVkImpl::EnqueueSignalFence(VkFence vkFence)
{
    DEV_CHECK_ERR(vkFence != VK_NULL_HANDLE, "vkFence must not be null");

    std::lock_guard<std::mutex> QueueGuard{m_QueueMutex};

    auto err = vkQueueSubmit(m_VkQueue, 0, nullptr, vkFence);
    DEV_CHECK_ERR(err == VK_SUCCESS, "Failed to submit fence signal command to the command queue");
    (void)err;
}